

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void * map_get(Map *map,void *key)

{
  long *plVar1;
  long *plVar2;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  plVar2 = (long *)map->elem[(ulong)key % (ulong)map->prime];
  if (plVar2 != (long *)0x0) {
    do {
      plVar1 = (long *)*plVar2;
      if (plVar1 == (long *)0x0) {
        return (void *)0x0;
      }
      plVar2 = plVar1 + 2;
    } while (*(void **)*plVar1 != key);
    pvVar3 = (void *)((long *)*plVar1)[1];
  }
  return pvVar3;
}

Assistant:

void *map_get(Map *map, void *key) {
    List *els = map_get_(map, key);
    if (els == NULL)return NULL;
    Elem *elem;
    ListNode *node = els->head;
    while (node != NULL) {
        elem = node->data;
        if (hash(key) == hash(elem->key)) {
            return elem->value;
        }
        node = node->next;
    }
    return NULL;
}